

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O3

BaseStatistics *
duckdb::BaseStatistics::CreateEmpty(BaseStatistics *__return_storage_ptr__,LogicalType *type)

{
  BaseStatistics *result;
  LogicalType *this;
  bool bVar1;
  LogicalType LStack_48;
  LogicalType local_30;
  
  this = &LStack_48;
  bVar1 = type->physical_type_ != BIT;
  if (bVar1) {
    LogicalType::LogicalType(&LStack_48,type);
    CreateEmptyType(__return_storage_ptr__,&LStack_48);
  }
  else {
    this = &local_30;
    LogicalType::LogicalType(this,type);
    BaseStatistics(__return_storage_ptr__,this);
  }
  LogicalType::~LogicalType(this);
  __return_storage_ptr__->has_null = false;
  __return_storage_ptr__->has_no_null = bVar1;
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics BaseStatistics::CreateEmpty(LogicalType type) {
	if (type.InternalType() == PhysicalType::BIT) {
		// FIXME: this special case should not be necessary
		// but currently InitializeEmpty sets StatsInfo::CAN_HAVE_VALID_VALUES
		BaseStatistics result(std::move(type));
		result.Set(StatsInfo::CANNOT_HAVE_NULL_VALUES);
		result.Set(StatsInfo::CANNOT_HAVE_VALID_VALUES);
		return result;
	}
	auto result = CreateEmptyType(std::move(type));
	result.InitializeEmpty();
	return result;
}